

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt_utils.h
# Opt level: O0

CFL_ALLOWED_TYPE store_cfl_required_rdo(AV1_COMMON *cm,MACROBLOCK *x)

{
  long in_RSI;
  long in_RDI;
  MACROBLOCKD *xd;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  CFL_ALLOWED_TYPE CVar1;
  
  if ((*(char *)(*(long *)(in_RDI + 0x6088) + 0x4d) == '\0') &&
     ((*(byte *)(in_RSI + 0x1ac) & 1) != 0)) {
    if ((*(byte *)(in_RSI + 0x1ac) & 1) == 0) {
      CVar1 = '\x01';
    }
    else {
      CVar1 = is_cfl_allowed((MACROBLOCKD *)
                             CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
    }
  }
  else {
    CVar1 = '\0';
  }
  return CVar1;
}

Assistant:

static inline CFL_ALLOWED_TYPE store_cfl_required_rdo(const AV1_COMMON *cm,
                                                      const MACROBLOCK *x) {
  const MACROBLOCKD *xd = &x->e_mbd;

  if (cm->seq_params->monochrome || !xd->is_chroma_ref) return CFL_DISALLOWED;

  if (!xd->is_chroma_ref) {
    // For non-chroma-reference blocks, we should always store the luma pixels,
    // in case the corresponding chroma-reference block uses CfL.
    // Note that this can only happen for block sizes which are <8 on
    // their shortest side, as otherwise they would be chroma reference
    // blocks.
    return CFL_ALLOWED;
  }

  // For chroma reference blocks, we should store data in the encoder iff we're
  // allowed to try out CfL.
  return is_cfl_allowed(xd);
}